

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  pointer *this;
  pointer *ppiVar1;
  result_type_conflict1 rVar2;
  result_type rVar3;
  result_type rVar4;
  reference pvVar5;
  ostream *poVar6;
  iterator iVar7;
  rep rVar8;
  iterator iVar9;
  iterator iVar10;
  size_type sVar11;
  float local_295c;
  float local_2954;
  duration<long,_std::ratio<1L,_1000000000L>_> local_2878;
  duration<long,_std::ratio<1L,_1000L>_> local_2870;
  float local_2864;
  duration<long,_std::ratio<1L,_1000000000L>_> local_2860;
  duration<long,_std::ratio<1L,_1000L>_> local_2858;
  float local_284c;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_2848;
  time_point t2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_2830;
  time_point t1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_2818;
  time_point t0;
  vector<int,_std::allocator<int>_> values_ref;
  vector<int,_std::allocator<int>_> values_ps;
  ulong uStack_27d8;
  int i_2;
  size_t i_1;
  ulong local_27c8;
  size_t i;
  uniform_int_distribution<int> dist_rand;
  uniform_int_distribution<int> dist_value;
  mt19937 mt;
  undefined1 local_1418 [8];
  random_device dev;
  float local_88;
  int num_randoms;
  float ps_result;
  float ref_result;
  vector<float,_std::allocator<float>_> ps_results;
  vector<float,_std::allocator<float>_> ref_results;
  vector<int,_std::allocator<int>_> ref;
  vector<int,_std::allocator<int>_> ps;
  int rounds;
  float randomness;
  int max_value;
  int count;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &ref_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&ps_result);
  num_randoms = 0;
  local_88 = 0.0;
  std::random_device::random_device((random_device *)local_1418);
  rVar2 = std::random_device::operator()((random_device *)local_1418);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&dist_value,(ulong)rVar2);
  std::uniform_int_distribution<int>::uniform_int_distribution(&dist_rand,0,100000);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&i,0,10000000);
  dev.field_0._M_mt._M_p._4_4_ = 1000000;
  for (local_27c8 = 0; local_27c8 < 10000000; local_27c8 = local_27c8 + 1) {
    i_1._4_4_ = (undefined4)local_27c8;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,(value_type *)((long)&i_1 + 4));
  }
  for (uStack_27d8 = 0; uStack_27d8 < (ulong)(long)(int)dev.field_0._M_mt._M_p._4_4_;
      uStack_27d8 = uStack_27d8 + 1) {
    rVar3 = std::uniform_int_distribution<int>::operator()
                      (&dist_rand,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dist_value);
    rVar4 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&i,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dist_value);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)rVar4);
    *pvVar5 = rVar3;
  }
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             &ref_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)
             &ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  poVar6 = std::operator<<((ostream *)&std::cout,"Sorting ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,10000000);
  poVar6 = std::operator<<(poVar6," integers with a size of ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,4);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  for (values_ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      values_ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < 10;
      values_ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           values_ps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    ppiVar1 = &values_ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)ppiVar1);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&t0);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)ppiVar1,
               (vector<int,_std::allocator<int>_> *)
               &ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)&t0,
               (vector<int,_std::allocator<int>_> *)
               &ref_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_2818.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    iVar7 = std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)&t0);
    t1.__d.__r = (duration)
                 std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)&t0);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)t1.__d.__r);
    local_2830.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    ppiVar1 = &values_ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    iVar7 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)ppiVar1);
    t2.__d.__r = (duration)
                 std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)ppiVar1);
    PatienceSortFunc<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)t2.__d.__r);
    local_2848.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_2860.__r = (rep)std::chrono::operator-(&local_2830,&local_2818);
    local_2858.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_2860);
    rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_2858);
    local_284c = (float)rVar8;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)
               &ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_284c);
    local_2878.__r = (rep)std::chrono::operator-(&local_2848,&local_2830);
    local_2870.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_2878);
    rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_2870);
    local_2864 = (float)rVar8;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&ps_result,&local_2864);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&t0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &values_ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  this = &ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  iVar9 = std::vector<float,_std::allocator<float>_>::begin
                    ((vector<float,_std::allocator<float>_> *)this);
  iVar10 = std::vector<float,_std::allocator<float>_>::end
                     ((vector<float,_std::allocator<float>_> *)this);
  std::
  for_each<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,main::__0>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             iVar9._M_current,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             iVar10._M_current,(anon_class_8_1_b2a21b07)&num_randoms);
  iVar9 = std::vector<float,_std::allocator<float>_>::begin
                    ((vector<float,_std::allocator<float>_> *)&ps_result);
  iVar10 = std::vector<float,_std::allocator<float>_>::end
                     ((vector<float,_std::allocator<float>_> *)&ps_result);
  std::
  for_each<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,main::__1>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             iVar9._M_current,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             iVar10._M_current,(anon_class_8_1_076e0479)&local_88);
  sVar11 = std::vector<float,_std::allocator<float>_>::size
                     ((vector<float,_std::allocator<float>_> *)
                      &ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  local_2954 = (float)sVar11;
  num_randoms = (int)((float)num_randoms / local_2954);
  sVar11 = std::vector<float,_std::allocator<float>_>::size
                     ((vector<float,_std::allocator<float>_> *)&ps_result);
  local_295c = (float)sVar11;
  local_88 = local_88 / local_295c;
  poVar6 = std::operator<<((ostream *)&std::cout,"std::sort:\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(float)num_randoms);
  poVar6 = std::operator<<(poVar6," ms");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Patience Sort:\t");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_88);
  poVar6 = std::operator<<(poVar6," ms");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::random_device::~random_device((random_device *)local_1418);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&ps_result);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &ps_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &ref_results.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &ref.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return 0;
}

Assistant:

int main() {

    const int count = 10000000;
    const int max_value = 100000;
    const float randomness = 0.1f;          // Use 10% random values

    const int rounds = 10;                  // builds the average from 10 cycles
    vector<int> ps, ref;
    vector<float> ref_results, ps_results;
    float ref_result = 0;
    float ps_result = 0;
    int num_randoms;

    std::random_device dev;
    std::mt19937 mt(dev());
    std::uniform_int_distribution<int> dist_value(0, max_value);
    std::uniform_int_distribution<int> dist_rand(0, count);


    num_randoms = count * randomness;
    for(size_t i = 0; i < count; i++) {
        ps.push_back(i);
    }
    for(size_t i = 0; i < num_randoms; i++) {
        ps[dist_rand(mt)] = dist_value(mt);
    }
    ref = ps;

    cout << "Sorting " << count << " integers with a size of " << sizeof(int) << endl;

    for(int i = 0; i < rounds; i++) {
        vector<int> values_ps, values_ref;
        values_ps = ps;
        values_ref = ref;

        auto t0 = std::chrono::high_resolution_clock::now();
        sort(values_ref.begin(), values_ref.end());
        auto t1 = std::chrono::high_resolution_clock::now();
        PatienceSortFunc(values_ps.begin(), values_ps.end());
        auto t2 = std::chrono::high_resolution_clock::now();


        ref_results.push_back(chrono::duration_cast<std::chrono::milliseconds>(t1 - t0).count());
        ps_results.push_back(chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count());

    }

    for_each(ref_results.begin(), ref_results.end(), [&](float f){ref_result += f;});
    for_each(ps_results.begin(), ps_results.end(), [&](float f){ps_result += f;});
    ref_result /= ref_results.size();
    ps_result /= ps_results.size();


    cout << "std::sort:\t" << ref_result << " ms" << endl;
    cout << "Patience Sort:\t" << ps_result << " ms" << endl;


    return 0;
}